

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::
ConstructorsAndUnsizedDeclStructConstructors<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ConstructorsAndUnsizedDeclStructConstructors<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  undefined8 dimension_index;
  TestError *pTVar1;
  undefined1 *local_1c8;
  string *fs;
  string *gs;
  string *tes;
  string *tcs;
  string *vs;
  string *cs;
  undefined1 local_178 [8];
  string shader_source;
  string local_150;
  allocator<char> local_129;
  string local_128;
  string local_108;
  allocator<char> local_e1;
  string local_e0 [32];
  string local_c0 [32];
  undefined1 local_a0 [8];
  string base_variable_string;
  size_t max_dimension_index;
  string local_70 [8];
  string example_structure_object;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string example_structure_definition;
  TestShaderType tested_shader_type_local;
  ConstructorsAndUnsizedDeclStructConstructors<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  example_structure_definition.field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,"struct light {\n    float intensity;\n    int position;\n};\n",
             &local_39);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"    light my_light_variable",
             (allocator<char> *)((long)&max_dimension_index + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&max_dimension_index + 7));
  for (base_variable_string.field_2._8_8_ = 2; (ulong)base_variable_string.field_2._8_8_ < 9;
      base_variable_string.field_2._8_8_ = base_variable_string.field_2._8_8_ + 1) {
    std::__cxx11::string::string(local_c0,local_70);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_e0,"[]",&local_e1);
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[6])(local_a0,this,local_c0,local_e0,base_variable_string.field_2._8_8_);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator(&local_e1);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::operator+=((string *)local_a0," = ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"light",&local_129);
    dimension_index = base_variable_string.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"1.0, 2",
               (allocator<char> *)(shader_source.field_2._M_local_buf + 0xf));
    recursively_initialise(&local_108,this,&local_128,dimension_index,&local_150);
    std::__cxx11::string::operator+=((string *)local_a0,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator((allocator<char> *)(shader_source.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
    std::__cxx11::string::operator+=((string *)local_a0,";\n\n");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   shader_start_abi_cxx11_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    std::__cxx11::string::~string((string *)&cs);
    switch(example_structure_definition.field_2._12_4_) {
    case 0:
      break;
    case 1:
      std::__cxx11::string::operator+=((string *)local_178,"\n\tgl_Position = vec4(0.0);\n");
      break;
    case 2:
      break;
    case 3:
      std::__cxx11::string::operator+=((string *)local_178,(string *)emit_quad_abi_cxx11_);
      break;
    case 4:
      std::__cxx11::string::operator+=((string *)local_178,(string *)set_tesseation_abi_cxx11_);
      break;
    case 5:
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x9fe);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=((string *)local_178,(string *)shader_end_abi_cxx11_);
    vs = (string *)empty_string_abi_cxx11_;
    tcs = (string *)default_vertex_shader_source_abi_cxx11_;
    tes = (string *)default_tc_shader_source_abi_cxx11_;
    gs = (string *)default_te_shader_source_abi_cxx11_;
    fs = (string *)default_geometry_shader_source_abi_cxx11_;
    local_1c8 = default_fragment_shader_source_abi_cxx11_;
    switch(example_structure_definition.field_2._12_4_) {
    case 0:
      local_1c8 = local_178;
      break;
    case 1:
      tcs = (string *)local_178;
      break;
    case 2:
      vs = (string *)local_178;
      tcs = (string *)empty_string_abi_cxx11_;
      tes = (string *)empty_string_abi_cxx11_;
      gs = (string *)empty_string_abi_cxx11_;
      fs = (string *)empty_string_abi_cxx11_;
      local_1c8 = empty_string_abi_cxx11_;
      break;
    case 3:
      fs = (string *)local_178;
      break;
    case 4:
      tes = (string *)local_178;
      break;
    case 5:
      gs = (string *)local_178;
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xa01);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[10])(this,tcs,tes,gs,fs,local_1c8,vs,1,0);
    std::__cxx11::string::~string((string *)local_178);
    std::__cxx11::string::~string((string *)local_a0);
  }
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void ConstructorsAndUnsizedDeclStructConstructors<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string example_structure_definition("struct light {\n"
											 "    float intensity;\n"
											 "    int position;\n"
											 "};\n");
	std::string example_structure_object("    light my_light_variable");

	for (size_t max_dimension_index = 2; max_dimension_index <= API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		std::string base_variable_string = this->extend_string(example_structure_object, "[]", max_dimension_index);
		base_variable_string += " = ";
		base_variable_string += recursively_initialise("light", max_dimension_index, "1.0, 2");
		base_variable_string += ";\n\n";

		std::string shader_source = example_structure_definition + shader_start + base_variable_string;

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int max_dimension_index = 2; ...) */
}